

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator-=(BN *this,BN *bn)

{
  ushort uVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  bool bVar7;
  ulong uStack_28;
  bt2s res;
  size_t pos;
  bool flag;
  BN *bn_local;
  BN *this_local;
  
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
  sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&bn->ba);
  if (sVar3 < sVar4) {
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&bn->ba);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,sVar3);
  }
  pos._7_1_ = false;
  uStack_28 = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&bn->ba);
    bVar7 = false;
    if (uStack_28 < sVar3) {
      sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      bVar7 = uStack_28 < sVar3;
    }
    if (!bVar7) break;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,uStack_28);
    uVar1 = *pvVar6;
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&bn->ba,uStack_28);
    iVar2 = ((uint)uVar1 - (uint)*pvVar5) - (uint)pos._7_1_;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,uStack_28);
    *pvVar6 = (value_type)iVar2;
    pos._7_1_ = iVar2 < 0;
    uStack_28 = uStack_28 + 1;
  }
  while( true ) {
    bVar7 = false;
    if (pos._7_1_ != false) {
      sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      bVar7 = uStack_28 < sVar3;
    }
    if (!bVar7) break;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,uStack_28);
    if (*pvVar6 != 0) {
      pos._7_1_ = false;
    }
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,uStack_28);
    *pvVar6 = *pvVar6 - 1;
    uStack_28 = uStack_28 + 1;
  }
  anon_unknown.dwarf_977c::Norm(&this->ba);
  return this;
}

Assistant:

BN& BN::operator -= (const BN& bn)
{
    if (ba.size() < bn.ba.size())
        ba.resize(bn.ba.size());

    bool flag = 0;
    size_t pos = 0;

    for (; pos < bn.ba.size() && pos < ba.size(); ++pos) {
        bt2s res = static_cast<bt2s>(ba[pos]) - bn.ba[pos] - flag;
        ba[pos] = static_cast<bt>(res);
        flag = (res < 0);
    }

    for (; flag && pos < ba.size(); ++pos) {
        if (ba[pos])
            flag = false;
        --ba[pos];
    }

    Norm(ba);
    return *this;
}